

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvp_fe_tests.cc
# Opt level: O0

void __thiscall
lf::uscalfe::test::lfe_bvpfe_bvp_demo_Test::~lfe_bvpfe_bvp_demo_Test(lfe_bvpfe_bvp_demo_Test *this)

{
  lfe_bvpfe_bvp_demo_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(lfe_bvpfe, bvp_demo) {
  std::cout << "Test: Solving elliptic BVP on triangle (test mesh 6)"
            << std::endl;

  // Description of BVP
  auto bvp_p = std::make_shared<DemoEllipticBVP>();

  // The solution and its gradient
  auto u = mesh::utils::MeshFunctionGlobal(
      [bvp_p](Eigen::Vector2d x) -> double { return bvp_p->u(x); });
  auto grad_u = mesh::utils::MeshFunctionGlobal(
      [bvp_p](Eigen::Vector2d x) -> Eigen::Vector2d {
        return bvp_p->grad_u(x);
      });
  // Compute error norms, specify test mesh #6 (no scaling)
  auto errnorms = TestConvergenceEllBVPFESol(REFLEV, bvp_p, u, grad_u, 6, 1.0);

  std::array<double, 8> exp_l2err{0.0124949,   0.00323273,  0.000813971,
                                  0.000203861, 5.09877e-05, 1.27481e-05,
                                  3.18709e-06, 7.96774e-07};
  std::array<double, 8> exp_h1serr{0.124964,   0.0636562,  0.0319577,
                                   0.0159956,  0.00799998, 0.00400027,
                                   0.00200017, 0.00100009};

  int k = 0;
  for (auto& err : errnorms) {
    if (k < 8) {
      EXPECT_NEAR(err.first, exp_l2err[k], 1.0E-5)
          << "Dubious L2 norm on level " << k;
      EXPECT_NEAR(err.second, exp_h1serr[k], 1.0E-5)
          << "Dubious H1 norm on level " << k;
      k++;
    }
  }
}